

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

bool docio_check_buffer(docio_handle *handle,bid_t bid,uint64_t sb_bmp_revnum)

{
  bool bVar1;
  undefined8 in_RSI;
  err_log_callback *in_RDI;
  uint64_t unaff_retaddr;
  err_log_callback *log_callback;
  
  _docio_read_through_buffer
            ((docio_handle *)log_callback,unaff_retaddr,in_RDI,SUB81((ulong)in_RSI >> 0x38,0));
  bVar1 = _docio_check_buffer((docio_handle *)log_callback,unaff_retaddr);
  return bVar1;
}

Assistant:

bool docio_check_buffer(struct docio_handle *handle,
                        bid_t bid,
                        uint64_t sb_bmp_revnum)
{
    err_log_callback *log_callback = handle->log_callback;
    _docio_read_through_buffer(handle, bid, log_callback, true);
    return _docio_check_buffer(handle, sb_bmp_revnum);
}